

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O2

void __thiscall ChunkedStackPool<4092>::~ChunkedStackPool(ChunkedStackPool<4092> *this)

{
  Reset(this);
  return;
}

Assistant:

~ChunkedStackPool()
	{
		Reset();
	}